

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog-inl.h
# Opt level: O0

void spdlog::set_formatter
               (unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter)

{
  registry *this;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_RDI;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_00000018;
  registry *in_stack_00000020;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_ffffffffffffffe0;
  
  this = details::registry::instance();
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)this,in_RDI);
  details::registry::set_formatter(in_stack_00000020,in_stack_00000018);
  CLI::std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (in_stack_ffffffffffffffe0);
  return;
}

Assistant:

SPDLOG_INLINE void set_formatter(std::unique_ptr<spdlog::formatter> formatter) {
    details::registry::instance().set_formatter(std::move(formatter));
}